

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_ThreeColourTriplets_Test::
~TEST_DoublingFactorCounterTest_ThreeColourTriplets_Test
          (TEST_DoublingFactorCounterTest_ThreeColourTriplets_Test *this)

{
  TEST_DoublingFactorCounterTest_ThreeColourTriplets_Test *mem;
  TEST_DoublingFactorCounterTest_ThreeColourTriplets_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_ThreeColourTriplets_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, ThreeColourTriplets)
{
	addPair(Tile::WestWind);
	addSequence(Tile::SevenOfCharacters, true);
	addTriplet(Tile::ThreeOfCharacters, true);
	addTriplet(Tile::ThreeOfCircles, false);
	addQuad(Tile::ThreeOfBamboos, false);	

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::ThreeColourTriplets));
	CHECK_EQUAL(2, r.doubling_factor);
}